

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_color.cxx
# Opt level: O0

void figure_out_visual(void)

{
  int local_20;
  int local_1c;
  int bs;
  int gs;
  int rs;
  uint n;
  XPixmapFormatValues *pfv;
  
  fl_xpixel(0x38);
  fl_xpixel(0xff);
  if (figure_out_visual::pfvlist == (XPixmapFormatValues *)0x0) {
    figure_out_visual::pfvlist =
         (XPixmapFormatValues *)XListPixmapFormats(fl_display,&figure_out_visual::FL_NUM_pfv);
  }
  for (_rs = figure_out_visual::pfvlist;
      (_rs < figure_out_visual::pfvlist + figure_out_visual::FL_NUM_pfv &&
      (_rs->depth != fl_visual->depth)); _rs = _rs + 1) {
  }
  xi.format = 2;
  xi.byte_order = *(int *)(fl_display + 0x50);
  xi.depth = fl_visual->depth;
  xi.bits_per_pixel = _rs->bits_per_pixel;
  if ((xi.bits_per_pixel & 7U) == 0) {
    bytes_per_pixel = xi.bits_per_pixel / 8;
  }
  else {
    bytes_per_pixel = 0;
  }
  gs = _rs->scanline_pad / 8;
  if (((_rs->scanline_pad & 7U) != 0) || ((gs & gs - 1U) != 0)) {
    (*Fl::fatal)("Can\'t do scanline_pad of %d",(ulong)(uint)_rs->scanline_pad,
                 (long)_rs->scanline_pad % 8 & 0xffffffff);
  }
  if ((uint)gs < 8) {
    gs = 8;
  }
  scanline_add = gs + -1;
  scanline_mask = -gs;
  if (bytes_per_pixel == 1) {
    converter = color8_converter;
    mono_converter = mono8_converter;
  }
  else {
    if (fl_visual->red_mask == 0) {
      (*Fl::fatal)("Can\'t do %d bits_per_pixel colormap",(ulong)(uint)xi.bits_per_pixel);
    }
    bs = fl_redshift;
    local_1c = fl_greenshift;
    local_20 = fl_blueshift;
    if (bytes_per_pixel == 2) {
      xi.byte_order = 0;
      if ((((fl_redshift == 0xb) && (fl_greenshift == 6)) && (fl_blueshift == 0)) &&
         (fl_extrashift == 3)) {
        converter = c565_converter;
        mono_converter = m565_converter;
      }
      else {
        converter = color16_converter;
        mono_converter = mono16_converter;
      }
    }
    else if (bytes_per_pixel == 3) {
      if (xi.byte_order != 0) {
        bs = 0x10 - fl_redshift;
        local_1c = 0x10 - fl_greenshift;
        local_20 = 0x10 - fl_blueshift;
      }
      if (((bs == 0) && (local_1c == 8)) && (local_20 == 0x10)) {
        converter = rgb_converter;
        mono_converter = rrr_converter;
      }
      else if (((bs == 0x10) && (local_1c == 8)) && (local_20 == 0)) {
        converter = bgr_converter;
        mono_converter = rrr_converter;
      }
      else {
        (*Fl::fatal)("Can\'t do arbitrary 24bit color");
      }
    }
    else if (bytes_per_pixel == 4) {
      if (xi.byte_order != 0) {
        bs = 0x18 - fl_redshift;
        local_1c = 0x18 - fl_greenshift;
        local_20 = 0x18 - fl_blueshift;
      }
      if (((bs == 0) && (local_1c == 8)) && (local_20 == 0x10)) {
        converter = xbgr_converter;
        mono_converter = xrrr_converter;
      }
      else if (((bs == 0x18) && (local_1c == 0x10)) && (local_20 == 8)) {
        converter = rgbx_converter;
        mono_converter = rrrx_converter;
      }
      else if (((bs == 8) && (local_1c == 0x10)) && (local_20 == 0x18)) {
        converter = bgrx_converter;
        mono_converter = rrrx_converter;
      }
      else if (((bs == 0x10) && (local_1c == 8)) && (local_20 == 0)) {
        converter = xrgb_converter;
        mono_converter = xrrr_converter;
      }
      else {
        xi.byte_order = 0;
        converter = color32_converter;
        mono_converter = mono32_converter;
      }
    }
    else {
      (*Fl::fatal)("Can\'t do %d bits_per_pixel",(ulong)(uint)xi.bits_per_pixel);
    }
  }
  return;
}

Assistant:

static void figure_out_visual() {
  beenhere = 1;
  if (!fl_visual->red_mask || !fl_visual->green_mask || !fl_visual->blue_mask){
#  if USE_COLORMAP
    fl_redmask = 0;
    return;
#  else
    Fl::fatal("Requires true color visual");
#  endif
  }

  // get the bit masks into a more useful form:
  int i,j,m;

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->red_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->red_mask & m)) break;
  fl_redshift = j-8;
  fl_redmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->green_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->green_mask & m)) break;
  fl_greenshift = j-8;
  fl_greenmask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  for (i = 0, m = 1; m; i++, m<<=1) if (fl_visual->blue_mask & m) break;
  for (j = i; m; j++, m<<=1) if (!(fl_visual->blue_mask & m)) break;
  fl_blueshift = j-8;
  fl_bluemask = (j-i >= 8) ? 0xFF : 0xFF-(255>>(j-i));

  i = fl_redshift;
  if (fl_greenshift < i) i = fl_greenshift;
  if (fl_blueshift < i) i = fl_blueshift;
  if (i < 0) {
    fl_extrashift = -i;
    fl_redshift -= i; fl_greenshift -= i; fl_blueshift -= i;
  } else
    fl_extrashift = 0;

}